

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::TemplatedFetchCommittedRange<duckdb::hugeint_t>
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  data_ptr_t pdVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  sel_t sVar5;
  ulong uVar6;
  
  sVar5 = info->N;
  if (sVar5 != 0) {
    puVar4 = (undefined8 *)((long)&info[1].segment + (ulong)info->max * 4);
    pdVar1 = result->data;
    uVar3 = 0;
    do {
      uVar6 = (ulong)*(uint *)((long)&info[1].segment + uVar3 * 4);
      if (start <= uVar6) {
        if (end <= uVar6) {
          return;
        }
        uVar2 = puVar4[1];
        *(undefined8 *)(pdVar1 + uVar6 * 0x10 + (result_offset - start) * 0x10) = *puVar4;
        *(undefined8 *)(pdVar1 + uVar6 * 0x10 + (result_offset - start) * 0x10 + 8) = uVar2;
        sVar5 = info->N;
      }
      uVar3 = uVar3 + 1;
      puVar4 = puVar4 + 2;
    } while (uVar3 < sVar5);
  }
  return;
}

Assistant:

static void MergeUpdateInfoRange(UpdateInfo &current, idx_t start, idx_t end, idx_t result_offset, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	for (idx_t i = 0; i < current.N; i++) {
		auto tuple_idx = tuples[i];
		if (tuple_idx < start) {
			continue;
		} else if (tuple_idx >= end) {
			break;
		}
		auto result_idx = result_offset + tuple_idx - start;
		result_data[result_idx] = info_data[i];
	}
}